

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isByteArray(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  Type *pTVar3;
  bool bVar4;
  
  pTVar2 = getCanonicalType(this);
  pTVar3 = getCanonicalType(pTVar2);
  SVar1 = (pTVar3->super_Symbol).kind;
  bVar4 = false;
  if (((SVar1 < PackedStructType) && (bVar4 = false, (0x9fffU >> ((byte)SVar1 & 0x1f) & 1) == 0)) &&
     (bVar4 = false, (pTVar2->super_Symbol).kind != AssociativeArrayType)) {
    pTVar2 = getArrayElementType(pTVar2);
    pTVar2 = getCanonicalType(pTVar2);
    pTVar3 = getCanonicalType(pTVar2);
    if ((pTVar3->super_Symbol).kind == PredefinedIntegerType) {
      bVar4 = (int)pTVar2[1].super_Symbol.name._M_len == 3;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool Type::isByteArray() const {
    const Type& ct = getCanonicalType();
    if (!ct.isUnpackedArray())
        return false;

    if (ct.kind == SymbolKind::AssociativeArrayType)
        return false;

    auto& elem = ct.getArrayElementType()->getCanonicalType();
    return elem.isPredefinedInteger() &&
           elem.as<PredefinedIntegerType>().integerKind == PredefinedIntegerType::Byte;
}